

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O2

void print_bus(mraa_board_t *board)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  int *piVar4;
  ulong uVar5;
  
  piVar4 = &board->i2c_bus[0].bus_id;
  for (uVar5 = 0; (long)uVar5 < (long)board->i2c_bus_count; uVar5 = uVar5 + 1) {
    if (board->platform_type == MRAA_FTDI_FT4222) {
      uVar1 = mraa_get_sub_platform_id(uVar5 & 0xffffffff);
      uVar2 = (ulong)uVar1;
      pcVar3 = "ft4222";
    }
    else {
      uVar2 = uVar5 & 0xffffffff;
      pcVar3 = "linux";
    }
    uVar1 = *piVar4;
    fprintf(_stdout,"Bus %3d: id=%02d type=%s ",uVar2,(ulong)uVar1,pcVar3);
    if (uVar5 == board->def_i2c_bus) {
      fwrite(" default",8,1,_stdout);
    }
    if (uVar1 == 0xffffffff) {
      fwrite(" disabled",9,1,_stdout);
    }
    fputc(10,_stdout);
    piVar4 = piVar4 + 6;
  }
  return;
}

Assistant:

void
print_bus(mraa_board_t* board)
{
    int i, bus;
    for (i = 0; i < board->i2c_bus_count; ++i) {
        char* busType;
        switch (board->platform_type) {
            case MRAA_FTDI_FT4222:
                busType = "ft4222";
                bus = mraa_get_sub_platform_id(i);
                break;
            default:
                busType = "linux";
                bus = i;
                break;
        }
        int id = board->i2c_bus[i].bus_id;
        fprintf(stdout, "Bus %3d: id=%02d type=%s ", bus, id, busType);
        if (i == board->def_i2c_bus)
            fprintf(stdout, " default");
        if (id == -1)
            fprintf(stdout, " disabled");

        fprintf(stdout, "\n");
    }
}